

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_16777232,_true,_embree::avx::SubdivPatch1MBIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [24];
  AABBNodeMB4D *node1;
  ulong uVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  undefined1 auVar59 [8];
  ulong uVar60;
  undefined1 auVar61 [8];
  long lVar62;
  undefined1 (*pauVar63) [16];
  long lVar64;
  ulong *puVar65;
  Primitive *prim;
  ulong uVar66;
  undefined1 (*pauVar67) [16];
  Geometry *pGVar68;
  ulong uVar69;
  ulong uVar70;
  float fVar71;
  float fVar72;
  float fVar78;
  float fVar79;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar80;
  undefined1 auVar77 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar98;
  float fVar99;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar100;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  float fVar104;
  float fVar105;
  float fVar112;
  float fVar113;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar111 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar138 [64];
  float fVar145;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar161;
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar165 [64];
  float fVar169;
  undefined1 auVar170 [32];
  float fVar179;
  undefined1 auVar171 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  float fVar180;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar188;
  float fVar190;
  float fVar192;
  float fVar194;
  undefined1 auVar183 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar191;
  float fVar193;
  undefined1 auVar184 [64];
  float fVar202;
  undefined1 auVar196 [16];
  float fVar195;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [64];
  float fVar206;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar211;
  undefined1 auVar210 [64];
  float fVar212;
  float fVar213;
  undefined1 auVar214 [32];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar215 [64];
  float fVar228;
  float fVar229;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar233 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  long local_cf0;
  int local_cd0;
  int local_ccc;
  ulong local_cc8;
  undefined1 local_cc0 [8];
  undefined1 auStack_cb8 [8];
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  undefined1 local_ca0 [8];
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined1 (*local_c78) [16];
  ulong local_c70;
  ulong local_c68;
  undefined8 local_c60;
  float fStack_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  undefined8 local_c40;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  float local_c14;
  float local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  uint local_c04;
  uint local_c00;
  RTCFilterFunctionNArguments local_bf0;
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined1 auStack_bb0 [8];
  float fStack_ba8;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [8];
  undefined1 auStack_b78 [8];
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 (**local_900) [16];
  undefined1 local_8e0 [32];
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_800 != 8) && (fVar3 = ray->tfar, 0.0 <= fVar3)) {
    puVar65 = local_7f8;
    auVar157 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
    aVar5 = (ray->dir).field_0;
    auVar74._8_4_ = 0x7fffffff;
    auVar74._0_8_ = 0x7fffffff7fffffff;
    auVar74._12_4_ = 0x7fffffff;
    auVar74 = vandps_avx((undefined1  [16])aVar5,auVar74);
    auVar128._8_4_ = 0x219392ef;
    auVar128._0_8_ = 0x219392ef219392ef;
    auVar128._12_4_ = 0x219392ef;
    auVar74 = vcmpps_avx(auVar74,auVar128,1);
    auVar124._8_4_ = 0x3f800000;
    auVar124._0_8_ = 0x3f8000003f800000;
    auVar124._12_4_ = 0x3f800000;
    auVar128 = vdivps_avx(auVar124,(undefined1  [16])aVar5);
    auVar125._8_4_ = 0x5d5e0b6b;
    auVar125._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar125._12_4_ = 0x5d5e0b6b;
    auVar74 = vblendvps_avx(auVar128,auVar125,auVar74);
    auVar196._0_4_ = auVar74._0_4_ * 0.99999964;
    auVar196._4_4_ = auVar74._4_4_ * 0.99999964;
    auVar196._8_4_ = auVar74._8_4_ * 0.99999964;
    auVar196._12_4_ = auVar74._12_4_ * 0.99999964;
    auVar89._0_4_ = auVar74._0_4_ * 1.0000004;
    auVar89._4_4_ = auVar74._4_4_ * 1.0000004;
    auVar89._8_4_ = auVar74._8_4_ * 1.0000004;
    auVar89._12_4_ = auVar74._12_4_ * 1.0000004;
    uVar4 = *(undefined4 *)&(ray->org).field_0;
    local_ac0._4_4_ = uVar4;
    local_ac0._0_4_ = uVar4;
    local_ac0._8_4_ = uVar4;
    local_ac0._12_4_ = uVar4;
    auVar160 = ZEXT1664(local_ac0);
    uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
    local_ad0._4_4_ = uVar4;
    local_ad0._0_4_ = uVar4;
    local_ad0._8_4_ = uVar4;
    local_ad0._12_4_ = uVar4;
    auVar165 = ZEXT1664(local_ad0);
    uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
    local_ae0._4_4_ = uVar4;
    local_ae0._0_4_ = uVar4;
    local_ae0._8_4_ = uVar4;
    local_ae0._12_4_ = uVar4;
    auVar172 = ZEXT1664(local_ae0);
    local_af0 = vshufps_avx(auVar196,auVar196,0);
    auVar184 = ZEXT1664(local_af0);
    auVar74 = vmovshdup_avx(auVar196);
    local_b00 = vshufps_avx(auVar196,auVar196,0x55);
    auVar199 = ZEXT1664(local_b00);
    auVar128 = vshufpd_avx(auVar196,auVar196,1);
    local_b10 = vshufps_avx(auVar196,auVar196,0xaa);
    auVar210 = ZEXT1664(local_b10);
    local_b20 = vshufps_avx(auVar89,auVar89,0);
    auVar215 = ZEXT1664(local_b20);
    local_b30 = vshufps_avx(auVar89,auVar89,0x55);
    auVar233 = ZEXT1664(local_b30);
    uVar58 = (ulong)(auVar196._0_4_ < 0.0) << 4;
    local_b40 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar247 = ZEXT1664(local_b40);
    uVar60 = (ulong)(auVar74._0_4_ < 0.0) << 4 | 0x20;
    uVar69 = (ulong)(auVar128._0_4_ < 0.0) << 4 | 0x40;
    uVar70 = uVar58 ^ 0x10;
    local_b50 = vshufps_avx(auVar157,auVar157,0);
    auVar138 = ZEXT1664(local_b50);
    local_aa0 = mm_lookupmask_pd._0_8_;
    uStack_a98 = mm_lookupmask_pd._8_8_;
    uStack_a90 = mm_lookupmask_pd._0_8_;
    uStack_a88 = mm_lookupmask_pd._8_8_;
    local_b60 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
    auVar150 = ZEXT1664(local_b60);
    local_cf0 = 0;
    local_cc8 = uVar58;
    do {
      uVar66 = puVar65[-1];
      puVar65 = puVar65 + -1;
      while ((uVar66 & 8) == 0) {
        uVar55 = uVar66 & 0xfffffffffffffff0;
        fVar3 = (ray->dir).field_0.m128[3];
        auVar73._4_4_ = fVar3;
        auVar73._0_4_ = fVar3;
        auVar73._8_4_ = fVar3;
        auVar73._12_4_ = fVar3;
        pfVar2 = (float *)(uVar55 + 0x80 + uVar58);
        pfVar1 = (float *)(uVar55 + 0x20 + uVar58);
        auVar157._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar157._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar157._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar157._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar74 = vsubps_avx(auVar157,auVar160._0_16_);
        auVar84._0_4_ = auVar184._0_4_ * auVar74._0_4_;
        auVar84._4_4_ = auVar184._4_4_ * auVar74._4_4_;
        auVar84._8_4_ = auVar184._8_4_ * auVar74._8_4_;
        auVar84._12_4_ = auVar184._12_4_ * auVar74._12_4_;
        pfVar2 = (float *)(uVar55 + 0x80 + uVar60);
        auVar74 = vmaxps_avx(auVar138._0_16_,auVar84);
        pfVar1 = (float *)(uVar55 + 0x20 + uVar60);
        auVar90._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar90._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar90._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar90._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar128 = vsubps_avx(auVar90,auVar165._0_16_);
        pfVar2 = (float *)(uVar55 + 0x80 + uVar69);
        pfVar1 = (float *)(uVar55 + 0x20 + uVar69);
        auVar106._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar106._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar106._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar106._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar91._0_4_ = auVar199._0_4_ * auVar128._0_4_;
        auVar91._4_4_ = auVar199._4_4_ * auVar128._4_4_;
        auVar91._8_4_ = auVar199._8_4_ * auVar128._8_4_;
        auVar91._12_4_ = auVar199._12_4_ * auVar128._12_4_;
        auVar128 = vsubps_avx(auVar106,auVar172._0_16_);
        auVar107._0_4_ = auVar210._0_4_ * auVar128._0_4_;
        auVar107._4_4_ = auVar210._4_4_ * auVar128._4_4_;
        auVar107._8_4_ = auVar210._8_4_ * auVar128._8_4_;
        auVar107._12_4_ = auVar210._12_4_ * auVar128._12_4_;
        auVar128 = vmaxps_avx(auVar91,auVar107);
        pfVar2 = (float *)(uVar55 + 0x80 + uVar70);
        pfVar1 = (float *)(uVar55 + 0x20 + uVar70);
        auVar108._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar108._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar108._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar108._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar74 = vmaxps_avx(auVar74,auVar128);
        auVar128 = vsubps_avx(auVar108,auVar160._0_16_);
        auVar92._0_4_ = auVar215._0_4_ * auVar128._0_4_;
        auVar92._4_4_ = auVar215._4_4_ * auVar128._4_4_;
        auVar92._8_4_ = auVar215._8_4_ * auVar128._8_4_;
        auVar92._12_4_ = auVar215._12_4_ * auVar128._12_4_;
        auVar128 = vminps_avx(auVar150._0_16_,auVar92);
        pfVar2 = (float *)(uVar55 + 0x80 + (uVar60 ^ 0x10));
        pfVar1 = (float *)(uVar55 + 0x20 + (uVar60 ^ 0x10));
        auVar109._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar109._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar109._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar109._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar157 = vsubps_avx(auVar109,auVar165._0_16_);
        auVar110._0_4_ = auVar233._0_4_ * auVar157._0_4_;
        auVar110._4_4_ = auVar233._4_4_ * auVar157._4_4_;
        auVar110._8_4_ = auVar233._8_4_ * auVar157._8_4_;
        auVar110._12_4_ = auVar233._12_4_ * auVar157._12_4_;
        pfVar2 = (float *)(uVar55 + 0x80 + (uVar69 ^ 0x10));
        pfVar1 = (float *)(uVar55 + 0x20 + (uVar69 ^ 0x10));
        auVar126._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar126._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar126._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar126._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar157 = vsubps_avx(auVar126,auVar172._0_16_);
        auVar127._0_4_ = auVar247._0_4_ * auVar157._0_4_;
        auVar127._4_4_ = auVar247._4_4_ * auVar157._4_4_;
        auVar127._8_4_ = auVar247._8_4_ * auVar157._8_4_;
        auVar127._12_4_ = auVar247._12_4_ * auVar157._12_4_;
        auVar157 = vminps_avx(auVar110,auVar127);
        auVar128 = vminps_avx(auVar128,auVar157);
        if (((uint)uVar66 & 7) == 6) {
          auVar128 = vcmpps_avx(auVar74,auVar128,2);
          auVar74 = vcmpps_avx(*(undefined1 (*) [16])(uVar55 + 0xe0),auVar73,2);
          auVar157 = vcmpps_avx(auVar73,*(undefined1 (*) [16])(uVar55 + 0xf0),1);
          auVar74 = vandps_avx(auVar74,auVar157);
          auVar74 = vandps_avx(auVar74,auVar128);
        }
        else {
          auVar74 = vcmpps_avx(auVar74,auVar128,2);
        }
        auVar74 = vpslld_avx(auVar74,0x1f);
        uVar56 = vmovmskps_avx(auVar74);
        if (uVar56 == 0) goto LAB_002c997c;
        uVar56 = uVar56 & 0xff;
        lVar8 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar66 = *(ulong *)(uVar55 + lVar8 * 8);
        uVar56 = uVar56 - 1 & uVar56;
        if (uVar56 != 0) {
          *puVar65 = uVar66;
          puVar65 = puVar65 + 1;
          lVar8 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
            }
          }
          uVar66 = *(ulong *)(uVar55 + lVar8 * 8);
          uVar56 = uVar56 - 1 & uVar56;
          uVar57 = (ulong)uVar56;
          if (uVar56 != 0) {
            do {
              *puVar65 = uVar66;
              puVar65 = puVar65 + 1;
              lVar8 = 0;
              if (uVar57 != 0) {
                for (; (uVar57 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              uVar66 = *(ulong *)(uVar55 + lVar8 * 8);
              uVar57 = uVar57 & uVar57 - 1;
            } while (uVar57 != 0);
          }
        }
      }
      if (((uint)uVar66 & 0xf) == 8) {
        uVar56 = *(uint *)(local_cf0 + 0xc);
        local_c70 = (ulong)uVar56;
        uVar7 = *(uint *)(local_cf0 + 0x10);
        local_c68 = (ulong)uVar7;
        lVar62 = (ulong)*(uint *)(local_cf0 + 0x24) + local_cf0 +
                 (long)local_cd0 * (ulong)*(uint *)(local_cf0 + 0x28);
        uVar66 = uVar66 >> 4;
        lVar8 = lVar62 + uVar66 * 4;
        lVar64 = lVar62 + uVar66 * 4 + 0x2c;
        auVar74 = *(undefined1 (*) [16])(lVar8 + 0x2c + local_c70 * 4);
        auVar128 = auVar74;
        if (2 < local_c68) {
          auVar128 = *(undefined1 (*) [16])(lVar64 + local_c70 * 8);
        }
        auVar157 = *(undefined1 (*) [16])(lVar62 + 0x2c + uVar66 * 4);
        if (local_c70 == 2) {
          auVar157 = vshufps_avx(auVar157,auVar157,0x54);
          auVar74 = vshufps_avx(auVar74,auVar74,0x54);
          auVar128 = vshufps_avx(auVar128,auVar128,0x54);
        }
        uVar58 = (ulong)*(uint *)(local_cf0 + 0x14);
        pauVar63 = (undefined1 (*) [16])(lVar8 + uVar58 * 4 + 0x2c);
        auVar89 = *(undefined1 (*) [16])(*pauVar63 + local_c70 * 4);
        auVar196 = auVar89;
        if (2 < uVar7) {
          auVar196 = *(undefined1 (*) [16])(*pauVar63 + local_c70 * 8);
        }
        auVar124 = *pauVar63;
        if (uVar56 == 2) {
          auVar124 = vshufps_avx(auVar124,auVar124,0x54);
          auVar89 = vshufps_avx(auVar89,auVar89,0x54);
          auVar196 = vshufps_avx(auVar196,auVar196,0x54);
        }
        pauVar67 = (undefined1 (*) [16])(lVar8 + uVar58 * 8 + 0x2c);
        auVar125 = *(undefined1 (*) [16])(*pauVar67 + local_c70 * 4);
        auVar73 = auVar125;
        if (2 < uVar7) {
          auVar73 = *(undefined1 (*) [16])(*pauVar67 + local_c70 * 8);
        }
        auVar84 = *pauVar67;
        if (uVar56 == 2) {
          auVar84 = vshufps_avx(auVar84,auVar84,0x54);
          auVar125 = vshufps_avx(auVar125,auVar125,0x54);
          auVar73 = vshufps_avx(auVar73,auVar73,0x54);
        }
        uVar66 = (ulong)(*(uint *)(local_cf0 + 0x28) & 0xfffffffc);
        auVar90 = *(undefined1 (*) [16])(lVar64 + uVar66 + local_c70 * 4);
        auVar91 = auVar90;
        if (2 < uVar7) {
          auVar91 = *(undefined1 (*) [16])(lVar64 + uVar66 + local_c70 * 8);
        }
        auVar92 = *(undefined1 (*) [16])(lVar64 + uVar66);
        if (uVar56 == 2) {
          auVar92 = vshufps_avx(auVar92,auVar92,0x54);
          auVar90 = vshufps_avx(auVar90,auVar90,0x54);
          auVar91 = vshufps_avx(auVar91,auVar91,0x54);
        }
        pauVar63 = (undefined1 (*) [16])(*pauVar63 + uVar66);
        auVar106 = *(undefined1 (*) [16])(*pauVar63 + local_c70 * 4);
        auVar107 = auVar106;
        if (2 < uVar7) {
          auVar107 = *(undefined1 (*) [16])(*pauVar63 + local_c70 * 8);
        }
        auVar108 = *pauVar63;
        if (uVar56 == 2) {
          auVar108 = vshufps_avx(auVar108,auVar108,0x54);
          auVar106 = vshufps_avx(auVar106,auVar106,0x54);
          auVar107 = vshufps_avx(auVar107,auVar107,0x54);
        }
        pauVar63 = (undefined1 (*) [16])(*pauVar67 + uVar66);
        auVar109 = *pauVar63;
        auVar110 = *(undefined1 (*) [16])(*pauVar63 + local_c70 * 4);
        auVar126 = auVar110;
        if (2 < uVar7) {
          auVar126 = *(undefined1 (*) [16])(*pauVar63 + local_c70 * 8);
        }
        auVar207._16_16_ = auVar74;
        auVar207._0_16_ = auVar157;
        auVar75._16_16_ = auVar128;
        auVar75._0_16_ = auVar74;
        auVar17 = vunpcklps_avx(auVar207,auVar75);
        auVar207 = vshufps_avx(auVar207,auVar207,0xa5);
        auVar75 = vshufps_avx(auVar75,auVar75,0x94);
        auVar93._16_16_ = auVar89;
        auVar93._0_16_ = auVar124;
        auVar129._16_16_ = auVar196;
        auVar129._0_16_ = auVar89;
        auVar18 = vunpcklps_avx(auVar93,auVar129);
        auVar93 = vshufps_avx(auVar93,auVar93,0xa5);
        auVar129 = vshufps_avx(auVar129,auVar129,0x94);
        auVar94._16_16_ = auVar125;
        auVar94._0_16_ = auVar84;
        auVar146._16_16_ = auVar73;
        auVar146._0_16_ = auVar125;
        auVar19 = vunpcklps_avx(auVar94,auVar146);
        auVar94 = vshufps_avx(auVar94,auVar94,0xa5);
        auVar146 = vshufps_avx(auVar146,auVar146,0x94);
        auVar147._16_16_ = auVar90;
        auVar147._0_16_ = auVar92;
        auVar181._16_16_ = auVar91;
        auVar181._0_16_ = auVar90;
        auVar20 = vunpcklps_avx(auVar147,auVar181);
        auVar147 = vshufps_avx(auVar147,auVar147,0xa5);
        auVar181 = vshufps_avx(auVar181,auVar181,0x94);
        auVar85._16_16_ = auVar106;
        auVar85._0_16_ = auVar108;
        auVar230._16_16_ = auVar107;
        auVar230._0_16_ = auVar106;
        auVar21 = vunpcklps_avx(auVar85,auVar230);
        auVar85 = vshufps_avx(auVar85,auVar85,0xa5);
        auVar230 = vshufps_avx(auVar230,auVar230,0x94);
        if (uVar56 == 2) {
          auVar109 = vshufps_avx(auVar109,auVar109,0x54);
          auVar110 = vshufps_avx(auVar110,auVar110,0x54);
          auVar126 = vshufps_avx(auVar126,auVar126,0x54);
        }
        auVar231._16_16_ = auVar110;
        auVar231._0_16_ = auVar109;
        auVar197._16_16_ = auVar126;
        auVar197._0_16_ = auVar110;
        auVar74 = vshufps_avx(local_ab0,local_ab0,0);
        auVar128 = ZEXT416((uint)(1.0 - local_ab0._0_4_));
        auVar128 = vshufps_avx(auVar128,auVar128,0);
        fVar206 = auVar74._0_4_;
        fVar211 = auVar74._4_4_;
        fVar114 = auVar74._8_4_;
        fVar116 = auVar74._12_4_;
        local_b80._0_4_ = auVar17._0_4_;
        local_b80._4_4_ = auVar17._4_4_;
        auStack_b78._0_4_ = auVar17._8_4_;
        auStack_b78._4_4_ = auVar17._12_4_;
        fStack_b70 = auVar17._16_4_;
        fStack_b6c = auVar17._20_4_;
        fStack_b68 = auVar17._24_4_;
        fVar72 = auVar128._0_4_;
        fVar166 = auVar128._4_4_;
        fVar167 = auVar128._8_4_;
        fVar168 = auVar128._12_4_;
        auVar95._0_4_ = fVar72 * (float)local_b80._0_4_ + fVar206 * auVar20._0_4_;
        auVar95._4_4_ = fVar166 * (float)local_b80._4_4_ + fVar211 * auVar20._4_4_;
        auVar95._8_4_ = fVar167 * (float)auStack_b78._0_4_ + fVar114 * auVar20._8_4_;
        auVar95._12_4_ = fVar168 * (float)auStack_b78._4_4_ + fVar116 * auVar20._12_4_;
        auVar95._16_4_ = fVar72 * fStack_b70 + fVar206 * auVar20._16_4_;
        auVar95._20_4_ = fVar166 * fStack_b6c + fVar211 * auVar20._20_4_;
        auVar95._24_4_ = fVar167 * fStack_b68 + fVar114 * auVar20._24_4_;
        auVar95._28_4_ = auVar20._28_4_ + 0.0;
        auVar76._0_4_ = fVar72 * auVar18._0_4_ + fVar206 * auVar21._0_4_;
        auVar76._4_4_ = fVar166 * auVar18._4_4_ + fVar211 * auVar21._4_4_;
        auVar76._8_4_ = fVar167 * auVar18._8_4_ + fVar114 * auVar21._8_4_;
        auVar76._12_4_ = fVar168 * auVar18._12_4_ + fVar116 * auVar21._12_4_;
        auVar76._16_4_ = fVar72 * auVar18._16_4_ + fVar206 * auVar21._16_4_;
        auVar76._20_4_ = fVar166 * auVar18._20_4_ + fVar211 * auVar21._20_4_;
        auVar76._24_4_ = fVar167 * auVar18._24_4_ + fVar114 * auVar21._24_4_;
        auVar76._28_4_ = auVar18._28_4_ + 0.0;
        auVar17 = vunpcklps_avx(auVar231,auVar197);
        auVar132._0_4_ = fVar72 * auVar19._0_4_ + fVar206 * auVar17._0_4_;
        auVar132._4_4_ = fVar166 * auVar19._4_4_ + fVar211 * auVar17._4_4_;
        auVar132._8_4_ = fVar167 * auVar19._8_4_ + fVar114 * auVar17._8_4_;
        auVar132._12_4_ = fVar168 * auVar19._12_4_ + fVar116 * auVar17._12_4_;
        auVar132._16_4_ = fVar72 * auVar19._16_4_ + fVar206 * auVar17._16_4_;
        auVar132._20_4_ = fVar166 * auVar19._20_4_ + fVar211 * auVar17._20_4_;
        auVar132._24_4_ = fVar167 * auVar19._24_4_ + fVar114 * auVar17._24_4_;
        auVar132._28_4_ = auVar17._28_4_ + 0.0;
        local_c40._0_4_ = auVar207._0_4_;
        local_c40._4_4_ = auVar207._4_4_;
        fStack_c38 = auVar207._8_4_;
        fStack_c34 = auVar207._12_4_;
        fStack_c30 = auVar207._16_4_;
        fStack_c2c = auVar207._20_4_;
        fStack_c28 = auVar207._24_4_;
        auVar158._0_4_ = fVar72 * (float)local_c40 + fVar206 * auVar147._0_4_;
        auVar158._4_4_ = fVar166 * local_c40._4_4_ + fVar211 * auVar147._4_4_;
        auVar158._8_4_ = fVar167 * fStack_c38 + fVar114 * auVar147._8_4_;
        auVar158._12_4_ = fVar168 * fStack_c34 + fVar116 * auVar147._12_4_;
        auVar158._16_4_ = fVar72 * fStack_c30 + fVar206 * auVar147._16_4_;
        auVar158._20_4_ = fVar166 * fStack_c2c + fVar211 * auVar147._20_4_;
        auVar158._24_4_ = fVar167 * fStack_c28 + fVar114 * auVar147._24_4_;
        auVar158._28_4_ = auVar147._28_4_ + 0.0;
        auVar207 = vshufps_avx(auVar231,auVar231,0xa5);
        auVar147 = vshufps_avx(auVar197,auVar197,0x94);
        local_bc0._0_4_ = auVar93._0_4_;
        local_bc0._4_4_ = auVar93._4_4_;
        fStack_bb8 = auVar93._8_4_;
        fStack_bb4 = auVar93._12_4_;
        auStack_bb0._0_4_ = auVar93._16_4_;
        auStack_bb0._4_4_ = auVar93._20_4_;
        fStack_ba8 = auVar93._24_4_;
        fVar3 = auVar19._28_4_;
        auVar182._0_4_ = fVar206 * auVar85._0_4_ + fVar72 * (float)local_bc0._0_4_;
        auVar182._4_4_ = fVar211 * auVar85._4_4_ + fVar166 * (float)local_bc0._4_4_;
        auVar182._8_4_ = fVar114 * auVar85._8_4_ + fVar167 * fStack_bb8;
        auVar182._12_4_ = fVar116 * auVar85._12_4_ + fVar168 * fStack_bb4;
        auVar182._16_4_ = fVar206 * auVar85._16_4_ + fVar72 * (float)auStack_bb0._0_4_;
        auVar182._20_4_ = fVar211 * auVar85._20_4_ + fVar166 * (float)auStack_bb0._4_4_;
        auVar182._24_4_ = fVar114 * auVar85._24_4_ + fVar167 * fStack_ba8;
        auVar182._28_4_ = auVar85._28_4_ + fVar3;
        auVar170._0_4_ = fVar206 * auVar207._0_4_ + fVar72 * auVar94._0_4_;
        auVar170._4_4_ = fVar211 * auVar207._4_4_ + fVar166 * auVar94._4_4_;
        auVar170._8_4_ = fVar114 * auVar207._8_4_ + fVar167 * auVar94._8_4_;
        auVar170._12_4_ = fVar116 * auVar207._12_4_ + fVar168 * auVar94._12_4_;
        auVar170._16_4_ = fVar206 * auVar207._16_4_ + fVar72 * auVar94._16_4_;
        auVar170._20_4_ = fVar211 * auVar207._20_4_ + fVar166 * auVar94._20_4_;
        auVar170._24_4_ = fVar114 * auVar207._24_4_ + fVar167 * auVar94._24_4_;
        auVar170._28_4_ = auVar207._28_4_ + fVar3;
        local_cc0._0_4_ = auVar75._0_4_;
        local_cc0._4_4_ = auVar75._4_4_;
        auStack_cb8._0_4_ = auVar75._8_4_;
        auStack_cb8._4_4_ = auVar75._12_4_;
        fStack_cb0 = auVar75._16_4_;
        fStack_cac = auVar75._20_4_;
        fStack_ca8 = auVar75._24_4_;
        auVar198._0_4_ = fVar72 * (float)local_cc0._0_4_ + fVar206 * auVar181._0_4_;
        auVar198._4_4_ = fVar166 * (float)local_cc0._4_4_ + fVar211 * auVar181._4_4_;
        auVar198._8_4_ = fVar167 * (float)auStack_cb8._0_4_ + fVar114 * auVar181._8_4_;
        auVar198._12_4_ = fVar168 * (float)auStack_cb8._4_4_ + fVar116 * auVar181._12_4_;
        auVar198._16_4_ = fVar72 * fStack_cb0 + fVar206 * auVar181._16_4_;
        auVar198._20_4_ = fVar166 * fStack_cac + fVar211 * auVar181._20_4_;
        auVar198._24_4_ = fVar167 * fStack_ca8 + fVar114 * auVar181._24_4_;
        auVar198._28_4_ = auVar181._28_4_ + fVar3;
        local_c60._0_4_ = auVar129._0_4_;
        local_c60._4_4_ = auVar129._4_4_;
        fStack_c58 = auVar129._8_4_;
        fStack_c54 = auVar129._12_4_;
        fStack_c50 = auVar129._16_4_;
        fStack_c4c = auVar129._20_4_;
        fStack_c48 = auVar129._24_4_;
        auVar208._0_4_ = fVar72 * (float)local_c60 + fVar206 * auVar230._0_4_;
        auVar208._4_4_ = fVar166 * local_c60._4_4_ + fVar211 * auVar230._4_4_;
        auVar208._8_4_ = fVar167 * fStack_c58 + fVar114 * auVar230._8_4_;
        auVar208._12_4_ = fVar168 * fStack_c54 + fVar116 * auVar230._12_4_;
        auVar208._16_4_ = fVar72 * fStack_c50 + fVar206 * auVar230._16_4_;
        auVar208._20_4_ = fVar166 * fStack_c4c + fVar211 * auVar230._20_4_;
        auVar208._24_4_ = fVar167 * fStack_c48 + fVar114 * auVar230._24_4_;
        auVar208._28_4_ = fVar3 + auVar230._28_4_;
        local_ca0._0_4_ = auVar146._0_4_;
        local_ca0._4_4_ = auVar146._4_4_;
        uStack_c98._0_4_ = auVar146._8_4_;
        uStack_c98._4_4_ = auVar146._12_4_;
        uStack_c90._0_4_ = auVar146._16_4_;
        uStack_c90._4_4_ = auVar146._20_4_;
        uStack_c88._0_4_ = auVar146._24_4_;
        uVar4 = *(undefined4 *)&(ray->org).field_0;
        auVar162._4_4_ = uVar4;
        auVar162._0_4_ = uVar4;
        auVar162._8_4_ = uVar4;
        auVar162._12_4_ = uVar4;
        auVar162._16_4_ = uVar4;
        auVar162._20_4_ = uVar4;
        auVar162._24_4_ = uVar4;
        auVar162._28_4_ = uVar4;
        uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
        auVar214._4_4_ = uVar4;
        auVar214._0_4_ = uVar4;
        auVar214._8_4_ = uVar4;
        auVar214._12_4_ = uVar4;
        auVar214._16_4_ = uVar4;
        auVar214._20_4_ = uVar4;
        auVar214._24_4_ = uVar4;
        auVar214._28_4_ = uVar4;
        auVar232._0_4_ = fVar72 * (float)local_ca0._0_4_ + fVar206 * auVar147._0_4_;
        auVar232._4_4_ = fVar166 * (float)local_ca0._4_4_ + fVar211 * auVar147._4_4_;
        auVar232._8_4_ = fVar167 * (float)uStack_c98 + fVar114 * auVar147._8_4_;
        auVar232._12_4_ = fVar168 * uStack_c98._4_4_ + fVar116 * auVar147._12_4_;
        auVar232._16_4_ = fVar72 * (float)uStack_c90 + fVar206 * auVar147._16_4_;
        auVar232._20_4_ = fVar166 * uStack_c90._4_4_ + fVar211 * auVar147._20_4_;
        auVar232._24_4_ = fVar167 * (float)uStack_c88 + fVar114 * auVar147._24_4_;
        auVar232._28_4_ = auVar230._28_4_ + auVar94._28_4_;
        uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
        auVar246._4_4_ = uVar4;
        auVar246._0_4_ = uVar4;
        auVar246._8_4_ = uVar4;
        auVar246._12_4_ = uVar4;
        auVar246._16_4_ = uVar4;
        auVar246._20_4_ = uVar4;
        auVar246._24_4_ = uVar4;
        auVar246._28_4_ = uVar4;
        _local_b80 = vsubps_avx(auVar95,auVar162);
        local_ba0 = vsubps_avx(auVar76,auVar214);
        _local_bc0 = vsubps_avx(auVar132,auVar246);
        auVar207 = vsubps_avx(auVar158,auVar162);
        auVar75 = vsubps_avx(auVar182,auVar214);
        auVar93 = vsubps_avx(auVar170,auVar246);
        auVar129 = vsubps_avx(auVar198,auVar162);
        auVar94 = vsubps_avx(auVar208,auVar214);
        auVar146 = vsubps_avx(auVar232,auVar246);
        local_980 = vsubps_avx(auVar129,_local_b80);
        local_9a0 = vsubps_avx(auVar94,local_ba0);
        local_9c0 = vsubps_avx(auVar146,_local_bc0);
        fVar3 = local_ba0._0_4_;
        fVar71 = auVar94._0_4_ + fVar3;
        fVar167 = local_ba0._4_4_;
        fVar78 = auVar94._4_4_ + fVar167;
        fVar211 = local_ba0._8_4_;
        fVar79 = auVar94._8_4_ + fVar211;
        fVar118 = local_ba0._12_4_;
        fVar80 = auVar94._12_4_ + fVar118;
        fVar123 = local_ba0._16_4_;
        fVar81 = auVar94._16_4_ + fVar123;
        fVar11 = local_ba0._20_4_;
        fVar82 = auVar94._20_4_ + fVar11;
        fVar14 = local_ba0._24_4_;
        fVar83 = auVar94._24_4_ + fVar14;
        fVar72 = local_bc0._0_4_;
        fVar169 = auVar146._0_4_ + fVar72;
        fVar168 = local_bc0._4_4_;
        fVar173 = auVar146._4_4_ + fVar168;
        fVar114 = local_bc0._8_4_;
        fVar174 = auVar146._8_4_ + fVar114;
        fVar120 = local_bc0._12_4_;
        fVar175 = auVar146._12_4_ + fVar120;
        fVar9 = local_bc0._16_4_;
        fVar176 = auVar146._16_4_ + fVar9;
        fVar12 = local_bc0._20_4_;
        fVar177 = auVar146._20_4_ + fVar12;
        fVar15 = local_bc0._24_4_;
        fVar178 = auVar146._24_4_ + fVar15;
        fVar105 = local_bc0._28_4_;
        fVar179 = auVar146._28_4_ + fVar105;
        fVar131 = local_9c0._0_4_;
        fVar139 = local_9c0._4_4_;
        auVar18._4_4_ = fVar139 * fVar78;
        auVar18._0_4_ = fVar131 * fVar71;
        fVar140 = local_9c0._8_4_;
        auVar18._8_4_ = fVar140 * fVar79;
        fVar141 = local_9c0._12_4_;
        auVar18._12_4_ = fVar141 * fVar80;
        fVar142 = local_9c0._16_4_;
        auVar18._16_4_ = fVar142 * fVar81;
        fVar143 = local_9c0._20_4_;
        auVar18._20_4_ = fVar143 * fVar82;
        fVar144 = local_9c0._24_4_;
        auVar18._24_4_ = fVar144 * fVar83;
        auVar18._28_4_ = auVar198._28_4_;
        fVar228 = local_9a0._0_4_;
        fVar234 = local_9a0._4_4_;
        auVar19._4_4_ = fVar234 * fVar173;
        auVar19._0_4_ = fVar228 * fVar169;
        fVar236 = local_9a0._8_4_;
        auVar19._8_4_ = fVar236 * fVar174;
        fVar238 = local_9a0._12_4_;
        auVar19._12_4_ = fVar238 * fVar175;
        fVar240 = local_9a0._16_4_;
        auVar19._16_4_ = fVar240 * fVar176;
        fVar242 = local_9a0._20_4_;
        auVar19._20_4_ = fVar242 * fVar177;
        fVar244 = local_9a0._24_4_;
        auVar19._24_4_ = fVar244 * fVar178;
        auVar19._28_4_ = auVar208._28_4_;
        auVar147 = vsubps_avx(auVar19,auVar18);
        fVar166 = local_b80._0_4_;
        fVar195 = auVar129._0_4_ + fVar166;
        fVar206 = local_b80._4_4_;
        fVar200 = auVar129._4_4_ + fVar206;
        fVar116 = local_b80._8_4_;
        fVar201 = auVar129._8_4_ + fVar116;
        fVar122 = local_b80._12_4_;
        fVar202 = auVar129._12_4_ + fVar122;
        fVar10 = local_b80._16_4_;
        fVar203 = auVar129._16_4_ + fVar10;
        fVar13 = local_b80._20_4_;
        fVar204 = auVar129._20_4_ + fVar13;
        fVar16 = local_b80._24_4_;
        fVar205 = auVar129._24_4_ + fVar16;
        fVar161 = auVar129._28_4_;
        fVar180 = local_980._0_4_;
        fVar185 = local_980._4_4_;
        auVar20._4_4_ = fVar185 * fVar173;
        auVar20._0_4_ = fVar180 * fVar169;
        fVar186 = local_980._8_4_;
        auVar20._8_4_ = fVar186 * fVar174;
        fVar187 = local_980._12_4_;
        auVar20._12_4_ = fVar187 * fVar175;
        fVar189 = local_980._16_4_;
        auVar20._16_4_ = fVar189 * fVar176;
        fVar191 = local_980._20_4_;
        auVar20._20_4_ = fVar191 * fVar177;
        fVar193 = local_980._24_4_;
        auVar20._24_4_ = fVar193 * fVar178;
        auVar20._28_4_ = fVar179;
        auVar21._4_4_ = fVar200 * fVar139;
        auVar21._0_4_ = fVar195 * fVar131;
        auVar21._8_4_ = fVar201 * fVar140;
        auVar21._12_4_ = fVar202 * fVar141;
        auVar21._16_4_ = fVar203 * fVar142;
        auVar21._20_4_ = fVar204 * fVar143;
        auVar21._24_4_ = fVar205 * fVar144;
        auVar21._28_4_ = auVar208._28_4_;
        auVar181 = vsubps_avx(auVar21,auVar20);
        auVar22._4_4_ = fVar234 * fVar200;
        auVar22._0_4_ = fVar228 * fVar195;
        auVar22._8_4_ = fVar236 * fVar201;
        auVar22._12_4_ = fVar238 * fVar202;
        auVar22._16_4_ = fVar240 * fVar203;
        auVar22._20_4_ = fVar242 * fVar204;
        auVar22._24_4_ = fVar244 * fVar205;
        auVar22._28_4_ = fVar161 + local_b80._28_4_;
        auVar23._4_4_ = fVar185 * fVar78;
        auVar23._0_4_ = fVar180 * fVar71;
        auVar23._8_4_ = fVar186 * fVar79;
        auVar23._12_4_ = fVar187 * fVar80;
        auVar23._16_4_ = fVar189 * fVar81;
        auVar23._20_4_ = fVar191 * fVar82;
        auVar23._24_4_ = fVar193 * fVar83;
        auVar23._28_4_ = auVar94._28_4_ + local_ba0._28_4_;
        local_c60._4_4_ = (ray->dir).field_0.m128[2];
        auVar85 = vsubps_avx(auVar23,auVar22);
        local_c40._4_4_ = (ray->dir).field_0.m128[1];
        local_9e0 = (ray->dir).field_0.m128[0];
        local_ca0._0_4_ =
             local_9e0 * auVar147._0_4_ +
             local_c40._4_4_ * auVar181._0_4_ + local_c60._4_4_ * auVar85._0_4_;
        local_ca0._4_4_ =
             local_9e0 * auVar147._4_4_ +
             local_c40._4_4_ * auVar181._4_4_ + local_c60._4_4_ * auVar85._4_4_;
        fVar81 = local_9e0 * auVar147._8_4_ +
                 local_c40._4_4_ * auVar181._8_4_ + local_c60._4_4_ * auVar85._8_4_;
        fVar169 = local_9e0 * auVar147._12_4_ +
                  local_c40._4_4_ * auVar181._12_4_ + local_c60._4_4_ * auVar85._12_4_;
        fVar175 = local_9e0 * auVar147._16_4_ +
                  local_c40._4_4_ * auVar181._16_4_ + local_c60._4_4_ * auVar85._16_4_;
        fVar178 = local_9e0 * auVar147._20_4_ +
                  local_c40._4_4_ * auVar181._20_4_ + local_c60._4_4_ * auVar85._20_4_;
        fVar201 = local_9e0 * auVar147._24_4_ +
                  local_c40._4_4_ * auVar181._24_4_ + local_c60._4_4_ * auVar85._24_4_;
        uStack_c88._4_4_ = auVar147._28_4_ + auVar181._28_4_ + auVar85._28_4_;
        uStack_c98._0_4_ = fVar81;
        uStack_c98._4_4_ = fVar169;
        uStack_c90._0_4_ = fVar175;
        uStack_c90._4_4_ = fVar178;
        auVar54 = _local_ca0;
        uStack_c88._0_4_ = fVar201;
        auVar230 = _local_ca0;
        local_a40 = vsubps_avx(local_ba0,auVar75);
        local_a60 = vsubps_avx(_local_bc0,auVar93);
        fVar78 = fVar3 + auVar75._0_4_;
        fVar80 = fVar167 + auVar75._4_4_;
        fVar83 = fVar211 + auVar75._8_4_;
        fVar174 = fVar118 + auVar75._12_4_;
        fVar177 = fVar123 + auVar75._16_4_;
        fVar200 = fVar11 + auVar75._20_4_;
        fVar203 = fVar14 + auVar75._24_4_;
        fVar82 = auVar93._0_4_ + fVar72;
        fVar173 = auVar93._4_4_ + fVar168;
        fVar176 = auVar93._8_4_ + fVar114;
        fVar195 = auVar93._12_4_ + fVar120;
        fVar202 = auVar93._16_4_ + fVar9;
        fVar204 = auVar93._20_4_ + fVar12;
        fVar205 = auVar93._24_4_ + fVar15;
        fVar229 = local_a60._0_4_;
        fVar235 = local_a60._4_4_;
        auVar24._4_4_ = fVar235 * fVar80;
        auVar24._0_4_ = fVar229 * fVar78;
        fVar237 = local_a60._8_4_;
        auVar24._8_4_ = fVar237 * fVar83;
        fVar239 = local_a60._12_4_;
        auVar24._12_4_ = fVar239 * fVar174;
        fVar241 = local_a60._16_4_;
        auVar24._16_4_ = fVar241 * fVar177;
        fVar243 = local_a60._20_4_;
        auVar24._20_4_ = fVar243 * fVar200;
        fVar245 = local_a60._24_4_;
        auVar24._24_4_ = fVar245 * fVar203;
        auVar24._28_4_ = fVar179;
        fVar212 = local_a40._0_4_;
        fVar216 = local_a40._4_4_;
        auVar25._4_4_ = fVar216 * fVar173;
        auVar25._0_4_ = fVar212 * fVar82;
        fVar218 = local_a40._8_4_;
        auVar25._8_4_ = fVar218 * fVar176;
        fVar220 = local_a40._12_4_;
        auVar25._12_4_ = fVar220 * fVar195;
        fVar222 = local_a40._16_4_;
        auVar25._16_4_ = fVar222 * fVar202;
        fVar224 = local_a40._20_4_;
        auVar25._20_4_ = fVar224 * fVar204;
        fVar226 = local_a40._24_4_;
        auVar25._24_4_ = fVar226 * fVar205;
        auVar25._28_4_ = fVar105;
        auVar147 = vsubps_avx(auVar25,auVar24);
        auVar181 = vsubps_avx(_local_b80,auVar207);
        fVar71 = auVar181._0_4_;
        fVar79 = auVar181._4_4_;
        auVar26._4_4_ = fVar79 * fVar173;
        auVar26._0_4_ = fVar71 * fVar82;
        fVar82 = auVar181._8_4_;
        auVar26._8_4_ = fVar82 * fVar176;
        fVar173 = auVar181._12_4_;
        auVar26._12_4_ = fVar173 * fVar195;
        fVar176 = auVar181._16_4_;
        auVar26._16_4_ = fVar176 * fVar202;
        fVar195 = auVar181._20_4_;
        auVar26._20_4_ = fVar195 * fVar204;
        fVar202 = auVar181._24_4_;
        auVar26._24_4_ = fVar202 * fVar205;
        auVar26._28_4_ = auVar93._28_4_ + fVar105;
        fVar204 = auVar207._0_4_ + fVar166;
        fVar205 = auVar207._4_4_ + fVar206;
        fVar179 = auVar207._8_4_ + fVar116;
        fVar188 = auVar207._12_4_ + fVar122;
        fVar190 = auVar207._16_4_ + fVar10;
        fVar192 = auVar207._20_4_ + fVar13;
        fVar194 = auVar207._24_4_ + fVar16;
        auVar27._4_4_ = fVar235 * fVar205;
        auVar27._0_4_ = fVar229 * fVar204;
        auVar27._8_4_ = fVar237 * fVar179;
        auVar27._12_4_ = fVar239 * fVar188;
        auVar27._16_4_ = fVar241 * fVar190;
        auVar27._20_4_ = fVar243 * fVar192;
        fVar105 = auVar207._28_4_;
        auVar27._24_4_ = fVar245 * fVar194;
        auVar27._28_4_ = fVar105;
        auVar85 = vsubps_avx(auVar27,auVar26);
        auVar28._4_4_ = fVar216 * fVar205;
        auVar28._0_4_ = fVar212 * fVar204;
        auVar28._8_4_ = fVar218 * fVar179;
        auVar28._12_4_ = fVar220 * fVar188;
        auVar28._16_4_ = fVar222 * fVar190;
        auVar28._20_4_ = fVar224 * fVar192;
        auVar28._24_4_ = fVar226 * fVar194;
        auVar28._28_4_ = fVar105;
        auVar29._4_4_ = fVar79 * fVar80;
        auVar29._0_4_ = fVar71 * fVar78;
        auVar29._8_4_ = fVar82 * fVar83;
        auVar29._12_4_ = fVar173 * fVar174;
        auVar29._16_4_ = fVar176 * fVar177;
        auVar29._20_4_ = fVar195 * fVar200;
        auVar29._24_4_ = fVar202 * fVar203;
        auVar29._28_4_ = auVar181._28_4_;
        auVar181 = vsubps_avx(auVar29,auVar28);
        local_940._0_4_ =
             local_9e0 * auVar147._0_4_ +
             local_c40._4_4_ * auVar85._0_4_ + local_c60._4_4_ * auVar181._0_4_;
        local_940._4_4_ =
             local_9e0 * auVar147._4_4_ +
             local_c40._4_4_ * auVar85._4_4_ + local_c60._4_4_ * auVar181._4_4_;
        local_940._8_4_ =
             local_9e0 * auVar147._8_4_ +
             local_c40._4_4_ * auVar85._8_4_ + local_c60._4_4_ * auVar181._8_4_;
        local_940._12_4_ =
             local_9e0 * auVar147._12_4_ +
             local_c40._4_4_ * auVar85._12_4_ + local_c60._4_4_ * auVar181._12_4_;
        local_940._16_4_ =
             local_9e0 * auVar147._16_4_ +
             local_c40._4_4_ * auVar85._16_4_ + local_c60._4_4_ * auVar181._16_4_;
        local_940._20_4_ =
             local_9e0 * auVar147._20_4_ +
             local_c40._4_4_ * auVar85._20_4_ + local_c60._4_4_ * auVar181._20_4_;
        local_940._24_4_ =
             local_9e0 * auVar147._24_4_ +
             local_c40._4_4_ * auVar85._24_4_ + local_c60._4_4_ * auVar181._24_4_;
        local_940._28_4_ = auVar85._28_4_ + auVar85._28_4_ + auVar181._28_4_;
        local_a20 = vsubps_avx(auVar207,auVar129);
        fVar88 = auVar207._0_4_ + auVar129._0_4_;
        fVar98 = auVar207._4_4_ + auVar129._4_4_;
        fVar99 = auVar207._8_4_ + auVar129._8_4_;
        fVar100 = auVar207._12_4_ + auVar129._12_4_;
        fVar101 = auVar207._16_4_ + auVar129._16_4_;
        fVar102 = auVar207._20_4_ + auVar129._20_4_;
        fVar103 = auVar207._24_4_ + auVar129._24_4_;
        local_a00 = vsubps_avx(auVar75,auVar94);
        fVar104 = auVar94._0_4_ + auVar75._0_4_;
        fVar112 = auVar94._4_4_ + auVar75._4_4_;
        fVar113 = auVar94._8_4_ + auVar75._8_4_;
        fVar115 = auVar94._12_4_ + auVar75._12_4_;
        fVar117 = auVar94._16_4_ + auVar75._16_4_;
        fVar119 = auVar94._20_4_ + auVar75._20_4_;
        fVar121 = auVar94._24_4_ + auVar75._24_4_;
        auVar129 = vsubps_avx(auVar93,auVar146);
        fVar204 = auVar93._0_4_ + auVar146._0_4_;
        fVar205 = auVar93._4_4_ + auVar146._4_4_;
        fVar179 = auVar93._8_4_ + auVar146._8_4_;
        fVar188 = auVar93._12_4_ + auVar146._12_4_;
        fVar190 = auVar93._16_4_ + auVar146._16_4_;
        fVar192 = auVar93._20_4_ + auVar146._20_4_;
        fVar194 = auVar93._24_4_ + auVar146._24_4_;
        fVar145 = auVar129._0_4_;
        fVar151 = auVar129._4_4_;
        auVar30._4_4_ = fVar151 * fVar112;
        auVar30._0_4_ = fVar145 * fVar104;
        fVar152 = auVar129._8_4_;
        auVar30._8_4_ = fVar152 * fVar113;
        fVar153 = auVar129._12_4_;
        auVar30._12_4_ = fVar153 * fVar115;
        fVar154 = auVar129._16_4_;
        auVar30._16_4_ = fVar154 * fVar117;
        fVar155 = auVar129._20_4_;
        auVar30._20_4_ = fVar155 * fVar119;
        fVar156 = auVar129._24_4_;
        auVar30._24_4_ = fVar156 * fVar121;
        auVar30._28_4_ = auVar147._28_4_;
        fVar78 = local_a00._0_4_;
        fVar80 = local_a00._4_4_;
        auVar31._4_4_ = fVar80 * fVar205;
        auVar31._0_4_ = fVar78 * fVar204;
        fVar83 = local_a00._8_4_;
        auVar31._8_4_ = fVar83 * fVar179;
        fVar174 = local_a00._12_4_;
        auVar31._12_4_ = fVar174 * fVar188;
        fVar177 = local_a00._16_4_;
        auVar31._16_4_ = fVar177 * fVar190;
        fVar200 = local_a00._20_4_;
        auVar31._20_4_ = fVar200 * fVar192;
        fVar203 = local_a00._24_4_;
        auVar31._24_4_ = fVar203 * fVar194;
        auVar31._28_4_ = fVar161;
        auVar207 = vsubps_avx(auVar31,auVar30);
        fVar213 = local_a20._0_4_;
        fVar217 = local_a20._4_4_;
        auVar32._4_4_ = fVar217 * fVar205;
        auVar32._0_4_ = fVar213 * fVar204;
        fVar219 = local_a20._8_4_;
        auVar32._8_4_ = fVar219 * fVar179;
        fVar221 = local_a20._12_4_;
        auVar32._12_4_ = fVar221 * fVar188;
        fVar223 = local_a20._16_4_;
        auVar32._16_4_ = fVar223 * fVar190;
        fVar225 = local_a20._20_4_;
        auVar32._20_4_ = fVar225 * fVar192;
        fVar227 = local_a20._24_4_;
        auVar32._24_4_ = fVar227 * fVar194;
        auVar32._28_4_ = auVar93._28_4_ + auVar146._28_4_;
        auVar33._4_4_ = fVar151 * fVar98;
        auVar33._0_4_ = fVar145 * fVar88;
        auVar33._8_4_ = fVar152 * fVar99;
        auVar33._12_4_ = fVar153 * fVar100;
        auVar33._16_4_ = fVar154 * fVar101;
        auVar33._20_4_ = fVar155 * fVar102;
        auVar33._24_4_ = fVar156 * fVar103;
        auVar33._28_4_ = fVar161;
        auVar93 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = fVar80 * fVar98;
        auVar34._0_4_ = fVar78 * fVar88;
        auVar34._8_4_ = fVar83 * fVar99;
        auVar34._12_4_ = fVar174 * fVar100;
        auVar34._16_4_ = fVar177 * fVar101;
        auVar34._20_4_ = fVar200 * fVar102;
        auVar34._24_4_ = fVar203 * fVar103;
        auVar34._28_4_ = fVar105 + fVar161;
        auVar35._4_4_ = fVar217 * fVar112;
        auVar35._0_4_ = fVar213 * fVar104;
        auVar35._8_4_ = fVar219 * fVar113;
        auVar35._12_4_ = fVar221 * fVar115;
        auVar35._16_4_ = fVar223 * fVar117;
        auVar35._20_4_ = fVar225 * fVar119;
        auVar35._24_4_ = fVar227 * fVar121;
        auVar35._28_4_ = auVar94._28_4_ + auVar75._28_4_;
        auVar75 = vsubps_avx(auVar35,auVar34);
        local_c60._0_4_ = local_c60._4_4_;
        fStack_c58 = local_c60._4_4_;
        fStack_c54 = local_c60._4_4_;
        fStack_c50 = local_c60._4_4_;
        fStack_c4c = local_c60._4_4_;
        fStack_c48 = local_c60._4_4_;
        fStack_c44 = local_c60._4_4_;
        local_c40._0_4_ = local_c40._4_4_;
        fStack_c38 = local_c40._4_4_;
        fStack_c34 = local_c40._4_4_;
        fStack_c30 = local_c40._4_4_;
        fStack_c2c = local_c40._4_4_;
        fStack_c28 = local_c40._4_4_;
        fStack_c24 = local_c40._4_4_;
        fStack_9dc = local_9e0;
        fStack_9d8 = local_9e0;
        fStack_9d4 = local_9e0;
        fStack_9d0 = local_9e0;
        fStack_9cc = local_9e0;
        fStack_9c8 = local_9e0;
        fStack_9c4 = local_9e0;
        auVar86._0_4_ =
             local_9e0 * auVar207._0_4_ +
             local_c40._4_4_ * auVar93._0_4_ + local_c60._4_4_ * auVar75._0_4_;
        auVar86._4_4_ =
             local_9e0 * auVar207._4_4_ +
             local_c40._4_4_ * auVar93._4_4_ + local_c60._4_4_ * auVar75._4_4_;
        auVar86._8_4_ =
             local_9e0 * auVar207._8_4_ +
             local_c40._4_4_ * auVar93._8_4_ + local_c60._4_4_ * auVar75._8_4_;
        auVar86._12_4_ =
             local_9e0 * auVar207._12_4_ +
             local_c40._4_4_ * auVar93._12_4_ + local_c60._4_4_ * auVar75._12_4_;
        auVar86._16_4_ =
             local_9e0 * auVar207._16_4_ +
             local_c40._4_4_ * auVar93._16_4_ + local_c60._4_4_ * auVar75._16_4_;
        auVar86._20_4_ =
             local_9e0 * auVar207._20_4_ +
             local_c40._4_4_ * auVar93._20_4_ + local_c60._4_4_ * auVar75._20_4_;
        auVar86._24_4_ =
             local_9e0 * auVar207._24_4_ +
             local_c40._4_4_ * auVar93._24_4_ + local_c60._4_4_ * auVar75._24_4_;
        auVar86._28_4_ = auVar75._28_4_ + auVar93._28_4_ + auVar75._28_4_;
        local_cc0._0_4_ = auVar86._0_4_ + (float)local_ca0._0_4_ + local_940._0_4_;
        local_cc0._4_4_ = auVar86._4_4_ + (float)local_ca0._4_4_ + local_940._4_4_;
        auStack_cb8._0_4_ = auVar86._8_4_ + fVar81 + local_940._8_4_;
        auStack_cb8._4_4_ = auVar86._12_4_ + fVar169 + local_940._12_4_;
        fStack_cb0 = auVar86._16_4_ + fVar175 + local_940._16_4_;
        fStack_cac = auVar86._20_4_ + fVar178 + local_940._20_4_;
        fStack_ca8 = auVar86._24_4_ + fVar201 + local_940._24_4_;
        register0x000012dc = auVar86._28_4_ + uStack_c88._4_4_ + local_940._28_4_;
        auVar207 = vminps_avx(_local_ca0,local_940);
        auVar207 = vminps_avx(auVar207,auVar86);
        auVar163._8_4_ = 0x7fffffff;
        auVar163._0_8_ = 0x7fffffff7fffffff;
        auVar163._12_4_ = 0x7fffffff;
        auVar163._16_4_ = 0x7fffffff;
        auVar163._20_4_ = 0x7fffffff;
        auVar163._24_4_ = 0x7fffffff;
        auVar163._28_4_ = 0x7fffffff;
        local_a80 = vandps_avx(auVar163,_local_cc0);
        fVar105 = local_a80._0_4_ * 1.1920929e-07;
        fVar204 = local_a80._4_4_ * 1.1920929e-07;
        auVar36._4_4_ = fVar204;
        auVar36._0_4_ = fVar105;
        fVar205 = local_a80._8_4_ * 1.1920929e-07;
        auVar36._8_4_ = fVar205;
        fVar179 = local_a80._12_4_ * 1.1920929e-07;
        auVar36._12_4_ = fVar179;
        fVar188 = local_a80._16_4_ * 1.1920929e-07;
        auVar36._16_4_ = fVar188;
        fVar190 = local_a80._20_4_ * 1.1920929e-07;
        auVar36._20_4_ = fVar190;
        fVar192 = local_a80._24_4_ * 1.1920929e-07;
        auVar36._24_4_ = fVar192;
        auVar36._28_4_ = 0x34000000;
        auVar130._0_8_ = CONCAT44(fVar204,fVar105) ^ 0x8000000080000000;
        auVar130._8_4_ = -fVar205;
        auVar130._12_4_ = -fVar179;
        auVar130._16_4_ = -fVar188;
        auVar130._20_4_ = -fVar190;
        auVar130._24_4_ = -fVar192;
        auVar130._28_4_ = 0xb4000000;
        auVar207 = vcmpps_avx(auVar207,auVar130,5);
        auVar93 = vmaxps_avx(_local_ca0,local_940);
        auVar75 = vmaxps_avx(auVar93,auVar86);
        auVar75 = vcmpps_avx(auVar75,auVar36,2);
        auVar75 = vorps_avx(auVar207,auVar75);
        local_c78 = (undefined1 (*) [16])(uVar58 * 0xc + lVar8 + 0x2c);
        auVar17._8_8_ = uStack_a98;
        auVar17._0_8_ = local_aa0;
        auVar17._16_8_ = uStack_a90;
        auVar17._24_8_ = uStack_a88;
        auVar17 = auVar17 & auVar75;
        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0x7f,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0xbf,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar17[0x1f] < '\0') {
          auVar37._4_4_ = fVar216 * fVar139;
          auVar37._0_4_ = fVar212 * fVar131;
          auVar37._8_4_ = fVar218 * fVar140;
          auVar37._12_4_ = fVar220 * fVar141;
          auVar37._16_4_ = fVar222 * fVar142;
          auVar37._20_4_ = fVar224 * fVar143;
          auVar37._24_4_ = fVar226 * fVar144;
          auVar37._28_4_ = SUB84(uStack_a88,4);
          auVar38._4_4_ = fVar234 * fVar235;
          auVar38._0_4_ = fVar228 * fVar229;
          auVar38._8_4_ = fVar236 * fVar237;
          auVar38._12_4_ = fVar238 * fVar239;
          auVar38._16_4_ = fVar240 * fVar241;
          auVar38._20_4_ = fVar242 * fVar243;
          auVar38._24_4_ = fVar244 * fVar245;
          auVar38._28_4_ = auVar207._28_4_;
          auVar94 = vsubps_avx(auVar38,auVar37);
          auVar39._4_4_ = fVar235 * fVar80;
          auVar39._0_4_ = fVar229 * fVar78;
          auVar39._8_4_ = fVar237 * fVar83;
          auVar39._12_4_ = fVar239 * fVar174;
          auVar39._16_4_ = fVar241 * fVar177;
          auVar39._20_4_ = fVar243 * fVar200;
          auVar39._24_4_ = fVar245 * fVar203;
          auVar39._28_4_ = 0x34000000;
          auVar40._4_4_ = fVar216 * fVar151;
          auVar40._0_4_ = fVar212 * fVar145;
          auVar40._8_4_ = fVar218 * fVar152;
          auVar40._12_4_ = fVar220 * fVar153;
          auVar40._16_4_ = fVar222 * fVar154;
          auVar40._20_4_ = fVar224 * fVar155;
          auVar40._24_4_ = fVar226 * fVar156;
          auVar40._28_4_ = auVar93._28_4_;
          auVar146 = vsubps_avx(auVar40,auVar39);
          auVar207 = vandps_avx(auVar163,auVar37);
          auVar93 = vandps_avx(auVar163,auVar39);
          auVar207 = vcmpps_avx(auVar207,auVar93,1);
          local_860 = vblendvps_avx(auVar146,auVar94,auVar207);
          auVar41._4_4_ = fVar79 * fVar151;
          auVar41._0_4_ = fVar71 * fVar145;
          auVar41._8_4_ = fVar82 * fVar152;
          auVar41._12_4_ = fVar173 * fVar153;
          auVar41._16_4_ = fVar176 * fVar154;
          auVar41._20_4_ = fVar195 * fVar155;
          auVar41._24_4_ = fVar202 * fVar156;
          auVar41._28_4_ = auVar94._28_4_;
          auVar42._4_4_ = fVar79 * fVar139;
          auVar42._0_4_ = fVar71 * fVar131;
          auVar42._8_4_ = fVar82 * fVar140;
          auVar42._12_4_ = fVar173 * fVar141;
          auVar42._16_4_ = fVar176 * fVar142;
          auVar42._20_4_ = fVar195 * fVar143;
          auVar42._24_4_ = fVar202 * fVar144;
          auVar42._28_4_ = auVar93._28_4_;
          auVar43._4_4_ = fVar185 * fVar235;
          auVar43._0_4_ = fVar180 * fVar229;
          auVar43._8_4_ = fVar186 * fVar237;
          auVar43._12_4_ = fVar187 * fVar239;
          auVar43._16_4_ = fVar189 * fVar241;
          auVar43._20_4_ = fVar191 * fVar243;
          auVar43._24_4_ = fVar193 * fVar245;
          auVar43._28_4_ = auVar146._28_4_;
          auVar94 = vsubps_avx(auVar42,auVar43);
          auVar44._4_4_ = fVar235 * fVar217;
          auVar44._0_4_ = fVar229 * fVar213;
          auVar44._8_4_ = fVar237 * fVar219;
          auVar44._12_4_ = fVar239 * fVar221;
          auVar44._16_4_ = fVar241 * fVar223;
          auVar44._20_4_ = fVar243 * fVar225;
          auVar44._24_4_ = fVar245 * fVar227;
          auVar44._28_4_ = auVar129._28_4_;
          auVar129 = vsubps_avx(auVar44,auVar41);
          auVar207 = vandps_avx(auVar163,auVar43);
          auVar93 = vandps_avx(auVar163,auVar41);
          auVar93 = vcmpps_avx(auVar207,auVar93,1);
          local_840 = vblendvps_avx(auVar129,auVar94,auVar93);
          auVar45._4_4_ = fVar216 * fVar217;
          auVar45._0_4_ = fVar212 * fVar213;
          auVar45._8_4_ = fVar218 * fVar219;
          auVar45._12_4_ = fVar220 * fVar221;
          auVar45._16_4_ = fVar222 * fVar223;
          auVar45._20_4_ = fVar224 * fVar225;
          auVar45._24_4_ = fVar226 * fVar227;
          auVar45._28_4_ = auVar75._28_4_;
          auVar46._4_4_ = fVar185 * fVar216;
          auVar46._0_4_ = fVar180 * fVar212;
          auVar46._8_4_ = fVar186 * fVar218;
          auVar46._12_4_ = fVar187 * fVar220;
          auVar46._16_4_ = fVar189 * fVar222;
          auVar46._20_4_ = fVar191 * fVar224;
          auVar46._24_4_ = fVar193 * fVar226;
          auVar46._28_4_ = auVar93._28_4_;
          auVar47._4_4_ = fVar234 * fVar79;
          auVar47._0_4_ = fVar228 * fVar71;
          auVar47._8_4_ = fVar236 * fVar82;
          auVar47._12_4_ = fVar238 * fVar173;
          auVar47._16_4_ = fVar240 * fVar176;
          auVar47._20_4_ = fVar242 * fVar195;
          auVar47._24_4_ = fVar244 * fVar202;
          auVar47._28_4_ = auVar94._28_4_;
          auVar48._4_4_ = fVar79 * fVar80;
          auVar48._0_4_ = fVar71 * fVar78;
          auVar48._8_4_ = fVar82 * fVar83;
          auVar48._12_4_ = fVar173 * fVar174;
          auVar48._16_4_ = fVar176 * fVar177;
          auVar48._20_4_ = fVar195 * fVar200;
          auVar48._24_4_ = fVar202 * fVar203;
          auVar48._28_4_ = auVar207._28_4_;
          auVar129 = vsubps_avx(auVar46,auVar47);
          auVar94 = vsubps_avx(auVar48,auVar45);
          auVar207 = vandps_avx(auVar163,auVar47);
          auVar93 = vandps_avx(auVar163,auVar45);
          auVar93 = vcmpps_avx(auVar207,auVar93,1);
          local_820 = vblendvps_avx(auVar94,auVar129,auVar93);
          fVar105 = auVar207._28_4_;
          fVar71 = local_860._0_4_ * local_9e0 +
                   local_840._0_4_ * local_c40._4_4_ + local_820._0_4_ * local_c60._4_4_;
          fVar78 = local_860._4_4_ * local_9e0 +
                   local_840._4_4_ * local_c40._4_4_ + local_820._4_4_ * local_c60._4_4_;
          fVar79 = local_860._8_4_ * local_9e0 +
                   local_840._8_4_ * local_c40._4_4_ + local_820._8_4_ * local_c60._4_4_;
          fVar80 = local_860._12_4_ * local_9e0 +
                   local_840._12_4_ * local_c40._4_4_ + local_820._12_4_ * local_c60._4_4_;
          fVar82 = local_860._16_4_ * local_9e0 +
                   local_840._16_4_ * local_c40._4_4_ + local_820._16_4_ * local_c60._4_4_;
          fVar83 = local_860._20_4_ * local_9e0 +
                   local_840._20_4_ * local_c40._4_4_ + local_820._20_4_ * local_c60._4_4_;
          fVar173 = local_860._24_4_ * local_9e0 +
                    local_840._24_4_ * local_c40._4_4_ + local_820._24_4_ * local_c60._4_4_;
          fVar174 = fVar105 + fVar105 + auVar129._28_4_;
          auVar96._0_4_ = fVar71 + fVar71;
          auVar96._4_4_ = fVar78 + fVar78;
          auVar96._8_4_ = fVar79 + fVar79;
          auVar96._12_4_ = fVar80 + fVar80;
          auVar96._16_4_ = fVar82 + fVar82;
          auVar96._20_4_ = fVar83 + fVar83;
          auVar96._24_4_ = fVar173 + fVar173;
          auVar96._28_4_ = fVar174 + fVar174;
          fVar71 = auVar94._28_4_;
          auVar207 = vrcpps_avx(auVar96);
          fVar78 = local_860._0_4_ * fVar166 + local_840._0_4_ * fVar3 + local_820._0_4_ * fVar72;
          fVar79 = local_860._4_4_ * fVar206 + local_840._4_4_ * fVar167 + local_820._4_4_ * fVar168
          ;
          fVar114 = local_860._8_4_ * fVar116 +
                    local_840._8_4_ * fVar211 + local_820._8_4_ * fVar114;
          fVar116 = local_860._12_4_ * fVar122 +
                    local_840._12_4_ * fVar118 + local_820._12_4_ * fVar120;
          fVar118 = local_860._16_4_ * fVar10 +
                    local_840._16_4_ * fVar123 + local_820._16_4_ * fVar9;
          fVar120 = local_860._20_4_ * fVar13 +
                    local_840._20_4_ * fVar11 + local_820._20_4_ * fVar12;
          fVar122 = local_860._24_4_ * fVar16 +
                    local_840._24_4_ * fVar14 + local_820._24_4_ * fVar15;
          fVar123 = fVar71 + fVar71 + fVar105;
          fVar3 = auVar207._0_4_;
          fVar72 = auVar207._4_4_;
          auVar49._4_4_ = auVar96._4_4_ * fVar72;
          auVar49._0_4_ = auVar96._0_4_ * fVar3;
          fVar166 = auVar207._8_4_;
          auVar49._8_4_ = auVar96._8_4_ * fVar166;
          fVar167 = auVar207._12_4_;
          auVar49._12_4_ = auVar96._12_4_ * fVar167;
          fVar168 = auVar207._16_4_;
          auVar49._16_4_ = auVar96._16_4_ * fVar168;
          fVar206 = auVar207._20_4_;
          auVar49._20_4_ = auVar96._20_4_ * fVar206;
          fVar211 = auVar207._24_4_;
          auVar49._24_4_ = auVar96._24_4_ * fVar211;
          auVar49._28_4_ = fVar71;
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = 0x3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar148._16_4_ = 0x3f800000;
          auVar148._20_4_ = 0x3f800000;
          auVar148._24_4_ = 0x3f800000;
          auVar148._28_4_ = 0x3f800000;
          auVar207 = vsubps_avx(auVar148,auVar49);
          uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
          auVar133._4_4_ = uVar4;
          auVar133._0_4_ = uVar4;
          auVar133._8_4_ = uVar4;
          auVar133._12_4_ = uVar4;
          auVar133._16_4_ = uVar4;
          auVar133._20_4_ = uVar4;
          auVar133._24_4_ = uVar4;
          auVar133._28_4_ = uVar4;
          local_880._4_4_ = (fVar79 + fVar79) * (fVar72 + fVar72 * auVar207._4_4_);
          local_880._0_4_ = (fVar78 + fVar78) * (fVar3 + fVar3 * auVar207._0_4_);
          local_880._8_4_ = (fVar114 + fVar114) * (fVar166 + fVar166 * auVar207._8_4_);
          local_880._12_4_ = (fVar116 + fVar116) * (fVar167 + fVar167 * auVar207._12_4_);
          local_880._16_4_ = (fVar118 + fVar118) * (fVar168 + fVar168 * auVar207._16_4_);
          local_880._20_4_ = (fVar120 + fVar120) * (fVar206 + fVar206 * auVar207._20_4_);
          local_880._24_4_ = (fVar122 + fVar122) * (fVar211 + fVar211 * auVar207._24_4_);
          local_880._28_4_ = fVar123 + fVar123;
          auVar207 = vcmpps_avx(auVar133,local_880,2);
          fVar3 = ray->tfar;
          auVar134._4_4_ = fVar3;
          auVar134._0_4_ = fVar3;
          auVar134._8_4_ = fVar3;
          auVar134._12_4_ = fVar3;
          auVar134._16_4_ = fVar3;
          auVar134._20_4_ = fVar3;
          auVar134._24_4_ = fVar3;
          auVar134._28_4_ = fVar3;
          auVar93 = vcmpps_avx(local_880,auVar134,2);
          auVar207 = vandps_avx(auVar207,auVar93);
          auVar93 = vcmpps_avx(auVar96,_DAT_01faff00,4);
          auVar207 = vandps_avx(auVar93,auVar207);
          auVar74 = vpslld_avx(auVar207._0_16_,0x1f);
          auVar128 = vpsrad_avx(auVar74,0x1f);
          auVar74 = vpslld_avx(auVar207._16_16_,0x1f);
          auVar74 = vpsrad_avx(auVar74,0x1f);
          auVar97._16_16_ = auVar74;
          auVar97._0_16_ = auVar128;
          auVar53._8_8_ = uStack_a98;
          auVar53._0_8_ = local_aa0;
          auVar53._16_8_ = uStack_a90;
          auVar53._24_8_ = uStack_a88;
          auVar207 = vandps_avx(auVar75,auVar53);
          auVar75 = auVar207 & auVar97;
          if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0x7f,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar75 >> 0xbf,0) != '\0') ||
              (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar75[0x1f] < '\0') {
            auVar61 = (undefined1  [8])CONCAT44(0,*(uint *)(local_cf0 + 0x18));
            auVar6._0_4_ = ray->tfar;
            auVar6._4_4_ = ray->mask;
            auVar6._8_4_ = ray->id;
            auVar6._12_4_ = ray->flags;
            local_8e0 = vandps_avx(auVar97,auVar207);
            uVar56 = vextractps_avx(auVar6,1);
            uStack_c90 = auVar54._16_8_;
            uStack_c88 = auVar230._24_8_;
            local_960 = local_ca0;
            uStack_958 = uStack_c98;
            uStack_950 = uStack_c90;
            uStack_948 = uStack_c88;
            local_920 = _local_cc0;
            local_900 = &local_c78;
            pGVar68 = (context->scene->geometries).items[(long)auVar61].ptr;
            if ((pGVar68->mask & uVar56) != 0) {
              auVar59 = (undefined1  [8])context->args;
              if ((((RTCIntersectArguments *)auVar59)->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar68->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002c9a92:
                ray->tfar = -INFINITY;
                return;
              }
              auVar74 = *(undefined1 (*) [16])(*local_c78 + local_c70 * 4);
              auVar128 = auVar74;
              if (2 < local_c68) {
                auVar128 = *(undefined1 (*) [16])(*local_c78 + local_c70 * 8);
              }
              auVar207 = vrcpps_avx(_local_cc0);
              fVar3 = auVar207._0_4_;
              fVar72 = auVar207._4_4_;
              auVar50._4_4_ = (float)local_cc0._4_4_ * fVar72;
              auVar50._0_4_ = (float)local_cc0._0_4_ * fVar3;
              fVar166 = auVar207._8_4_;
              auVar50._8_4_ = (float)auStack_cb8._0_4_ * fVar166;
              fVar167 = auVar207._12_4_;
              auVar50._12_4_ = (float)auStack_cb8._4_4_ * fVar167;
              fVar168 = auVar207._16_4_;
              auVar50._16_4_ = fStack_cb0 * fVar168;
              fVar206 = auVar207._20_4_;
              auVar50._20_4_ = fStack_cac * fVar206;
              fVar211 = auVar207._24_4_;
              auVar50._24_4_ = fStack_ca8 * fVar211;
              auVar50._28_4_ = register0x000012dc;
              auVar135._8_4_ = 0x3f800000;
              auVar135._0_8_ = 0x3f8000003f800000;
              auVar135._12_4_ = 0x3f800000;
              auVar135._16_4_ = 0x3f800000;
              auVar135._20_4_ = 0x3f800000;
              auVar135._24_4_ = 0x3f800000;
              auVar135._28_4_ = 0x3f800000;
              auVar75 = vsubps_avx(auVar135,auVar50);
              auVar77._0_4_ = fVar3 + fVar3 * auVar75._0_4_;
              auVar77._4_4_ = fVar72 + fVar72 * auVar75._4_4_;
              auVar77._8_4_ = fVar166 + fVar166 * auVar75._8_4_;
              auVar77._12_4_ = fVar167 + fVar167 * auVar75._12_4_;
              auVar77._16_4_ = fVar168 + fVar168 * auVar75._16_4_;
              auVar77._20_4_ = fVar206 + fVar206 * auVar75._20_4_;
              auVar77._24_4_ = fVar211 + fVar211 * auVar75._24_4_;
              auVar77._28_4_ = auVar207._28_4_ + auVar75._28_4_;
              auVar87._8_4_ = 0x219392ef;
              auVar87._0_8_ = 0x219392ef219392ef;
              auVar87._12_4_ = 0x219392ef;
              auVar87._16_4_ = 0x219392ef;
              auVar87._20_4_ = 0x219392ef;
              auVar87._24_4_ = 0x219392ef;
              auVar87._28_4_ = 0x219392ef;
              auVar207 = vcmpps_avx(local_a80,auVar87,5);
              auVar207 = vandps_avx(auVar207,auVar77);
              auVar51._4_4_ = auVar207._4_4_ * (float)local_ca0._4_4_;
              auVar51._0_4_ = auVar207._0_4_ * (float)local_ca0._0_4_;
              auVar51._8_4_ = auVar207._8_4_ * fVar81;
              auVar51._12_4_ = auVar207._12_4_ * fVar169;
              auVar51._16_4_ = auVar207._16_4_ * fVar175;
              auVar51._20_4_ = auVar207._20_4_ * fVar178;
              auVar51._24_4_ = auVar207._24_4_ * fVar201;
              auVar51._28_4_ = auVar77._28_4_;
              auVar75 = vminps_avx(auVar51,auVar135);
              auVar52._4_4_ = local_940._4_4_ * auVar207._4_4_;
              auVar52._0_4_ = local_940._0_4_ * auVar207._0_4_;
              auVar52._8_4_ = local_940._8_4_ * auVar207._8_4_;
              auVar52._12_4_ = local_940._12_4_ * auVar207._12_4_;
              auVar52._16_4_ = local_940._16_4_ * auVar207._16_4_;
              auVar52._20_4_ = local_940._20_4_ * auVar207._20_4_;
              auVar52._24_4_ = local_940._24_4_ * auVar207._24_4_;
              auVar52._28_4_ = auVar207._28_4_;
              auVar207 = vminps_avx(auVar52,auVar135);
              auVar157 = *local_c78;
              if (local_c70 == 2) {
                auVar157 = vpshufd_avx(auVar157,0x54);
                auVar74 = vpshufd_avx(auVar74,0x54);
                auVar128 = vpshufd_avx(auVar128,0x54);
              }
              auVar149._16_16_ = auVar74;
              auVar149._0_16_ = auVar157;
              auVar159._16_16_ = auVar128;
              auVar159._0_16_ = auVar74;
              auVar93 = vunpcklps_avx(auVar149,auVar159);
              auVar157 = vpshufd_avx(auVar157,0xa5);
              auVar89 = vpshufd_avx(auVar74,0xa5);
              auVar164._16_16_ = auVar89;
              auVar164._0_16_ = auVar157;
              auVar74 = vpshufd_avx(auVar74,0x94);
              auVar128 = vpshufd_avx(auVar128,0x94);
              auVar171._16_16_ = auVar128;
              auVar171._0_16_ = auVar74;
              auVar183._0_16_ = vpsrld_avx(auVar93._0_16_,0x10);
              auVar196 = vpsrld_avx(auVar93._16_16_,0x10);
              auVar209._8_4_ = 0xffff;
              auVar209._0_8_ = 0xffff0000ffff;
              auVar209._12_4_ = 0xffff;
              auVar209._16_4_ = 0xffff;
              auVar209._20_4_ = 0xffff;
              auVar209._24_4_ = 0xffff;
              auVar209._28_4_ = 0xffff;
              auVar93 = vandps_avx(auVar209,auVar93);
              auVar129 = vcvtdq2ps_avx(auVar93);
              auVar183._16_16_ = auVar196;
              auVar94 = vcvtdq2ps_avx(auVar183);
              auVar136._0_16_ = vpsrld_avx(auVar157,0x10);
              auVar157 = vpsrld_avx(auVar89,0x10);
              auVar93 = vandps_avx(auVar164,auVar209);
              auVar146 = vcvtdq2ps_avx(auVar93);
              auVar136._16_16_ = auVar157;
              auVar147 = vcvtdq2ps_avx(auVar136);
              auVar111._0_16_ = vpsrld_avx(auVar74,0x10);
              auVar74 = vpsrld_avx(auVar128,0x10);
              auVar93 = vandps_avx(auVar171,auVar209);
              auVar93 = vcvtdq2ps_avx(auVar93);
              auVar111._16_16_ = auVar74;
              auVar181 = vcvtdq2ps_avx(auVar111);
              auVar137._8_4_ = 0x3f800000;
              auVar137._0_8_ = 0x3f8000003f800000;
              auVar137._12_4_ = 0x3f800000;
              auVar137._16_4_ = 0x3f800000;
              auVar137._20_4_ = 0x3f800000;
              auVar137._24_4_ = 0x3f800000;
              auVar137._28_4_ = 0x3f800000;
              auVar85 = vsubps_avx(auVar137,auVar75);
              auVar85 = vsubps_avx(auVar85,auVar207);
              local_8c0[0] = auVar207._0_4_ * auVar93._0_4_ * 0.00012207031 +
                             auVar146._0_4_ * 0.00012207031 * auVar75._0_4_ +
                             auVar85._0_4_ * auVar129._0_4_ * 0.00012207031;
              local_8c0[1] = auVar207._4_4_ * auVar93._4_4_ * 0.00012207031 +
                             auVar146._4_4_ * 0.00012207031 * auVar75._4_4_ +
                             auVar85._4_4_ * auVar129._4_4_ * 0.00012207031;
              local_8c0[2] = auVar207._8_4_ * auVar93._8_4_ * 0.00012207031 +
                             auVar146._8_4_ * 0.00012207031 * auVar75._8_4_ +
                             auVar85._8_4_ * auVar129._8_4_ * 0.00012207031;
              local_8c0[3] = auVar207._12_4_ * auVar93._12_4_ * 0.00012207031 +
                             auVar146._12_4_ * 0.00012207031 * auVar75._12_4_ +
                             auVar85._12_4_ * auVar129._12_4_ * 0.00012207031;
              fStack_8b0 = auVar207._16_4_ * auVar93._16_4_ * 0.00012207031 +
                           auVar146._16_4_ * 0.00012207031 * auVar75._16_4_ +
                           auVar85._16_4_ * auVar129._16_4_ * 0.00012207031;
              fStack_8ac = auVar207._20_4_ * auVar93._20_4_ * 0.00012207031 +
                           auVar146._20_4_ * 0.00012207031 * auVar75._20_4_ +
                           auVar85._20_4_ * auVar129._20_4_ * 0.00012207031;
              fStack_8a8 = auVar207._24_4_ * auVar93._24_4_ * 0.00012207031 +
                           auVar146._24_4_ * 0.00012207031 * auVar75._24_4_ +
                           auVar85._24_4_ * auVar129._24_4_ * 0.00012207031;
              fStack_8a4 = auVar93._28_4_ + 0.0 + auVar207._28_4_;
              local_8a0[0] = auVar207._0_4_ * auVar181._0_4_ * 0.00012207031 +
                             auVar75._0_4_ * auVar147._0_4_ * 0.00012207031 +
                             auVar94._0_4_ * 0.00012207031 * auVar85._0_4_;
              local_8a0[1] = auVar207._4_4_ * auVar181._4_4_ * 0.00012207031 +
                             auVar75._4_4_ * auVar147._4_4_ * 0.00012207031 +
                             auVar94._4_4_ * 0.00012207031 * auVar85._4_4_;
              local_8a0[2] = auVar207._8_4_ * auVar181._8_4_ * 0.00012207031 +
                             auVar75._8_4_ * auVar147._8_4_ * 0.00012207031 +
                             auVar94._8_4_ * 0.00012207031 * auVar85._8_4_;
              local_8a0[3] = auVar207._12_4_ * auVar181._12_4_ * 0.00012207031 +
                             auVar75._12_4_ * auVar147._12_4_ * 0.00012207031 +
                             auVar94._12_4_ * 0.00012207031 * auVar85._12_4_;
              fStack_890 = auVar207._16_4_ * auVar181._16_4_ * 0.00012207031 +
                           auVar75._16_4_ * auVar147._16_4_ * 0.00012207031 +
                           auVar94._16_4_ * 0.00012207031 * auVar85._16_4_;
              fStack_88c = auVar207._20_4_ * auVar181._20_4_ * 0.00012207031 +
                           auVar75._20_4_ * auVar147._20_4_ * 0.00012207031 +
                           auVar94._20_4_ * 0.00012207031 * auVar85._20_4_;
              fStack_888 = auVar207._24_4_ * auVar181._24_4_ * 0.00012207031 +
                           auVar75._24_4_ * auVar147._24_4_ * 0.00012207031 +
                           auVar94._24_4_ * 0.00012207031 * auVar85._24_4_;
              fStack_884 = auVar181._28_4_ + auVar147._28_4_ + auVar85._28_4_;
              uVar56 = vmovmskps_avx(local_8e0);
              uVar66 = (ulong)uVar56;
              uVar58 = 0;
              if (uVar66 != 0) {
                for (; (uVar56 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                }
              }
              if (uVar56 != 0) {
                local_c40 = context->user;
                local_cc0 = auVar59;
                local_b80 = auVar61;
                local_ba0._0_4_ = *(undefined4 *)(local_cf0 + 0x1c);
                _local_bc0 = auVar6;
                local_c60 = pGVar68;
                local_c0c = *(undefined4 *)(local_cf0 + 0x1c);
                _local_ca0 = auVar230;
                do {
                  local_ca0 = (undefined1  [8])uVar66;
                  local_c14 = local_8c0[uVar58];
                  local_c10 = local_8a0[uVar58];
                  ray->tfar = *(float *)(local_880 + uVar58 * 4);
                  local_c20 = *(undefined4 *)(local_860 + uVar58 * 4);
                  local_c1c = *(undefined4 *)(local_840 + uVar58 * 4);
                  local_c18 = *(undefined4 *)(local_820 + uVar58 * 4);
                  local_c08 = SUB84(auVar61,0);
                  local_c04 = local_c40->instID[0];
                  local_c00 = local_c40->instPrimID[0];
                  local_ccc = -1;
                  local_bf0.valid = &local_ccc;
                  local_bf0.geometryUserPtr = pGVar68->userPtr;
                  local_bf0.context = local_c40;
                  local_bf0.hit = (RTCHitN *)&local_c20;
                  local_bf0.N = 1;
                  local_bf0.ray = (RTCRayN *)ray;
                  if (pGVar68->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002c9865:
                    if ((((RTCIntersectArguments *)auVar59)->filter == (RTCFilterFunctionN)0x0) ||
                       (((((RTCIntersectArguments *)auVar59)->flags &
                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) == RTC_RAY_QUERY_FLAG_INCOHERENT
                        && ((*(byte *)((long)local_c60 + 0x3e) & 0x40) == 0)))) goto LAB_002c9a92;
                    (*((RTCIntersectArguments *)auVar59)->filter)(&local_bf0);
                    if (*local_bf0.valid != 0) goto LAB_002c9a92;
                  }
                  else {
                    (*pGVar68->occlusionFilterN)(&local_bf0);
                    auVar59 = local_cc0;
                    if (*local_bf0.valid != 0) goto LAB_002c9865;
                  }
                  ray->tfar = (float)local_bc0._0_4_;
                  uVar66 = (ulong)local_ca0 ^ 1L << (uVar58 & 0x3f);
                  uVar58 = 0;
                  if (uVar66 != 0) {
                    for (; (uVar66 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                    }
                  }
                  auVar59 = local_cc0;
                  auVar61 = local_b80;
                  pGVar68 = local_c60;
                  local_c0c = local_ba0._0_4_;
                } while (uVar66 != 0);
              }
            }
          }
        }
        auVar172 = ZEXT1664(local_ae0);
        auVar165 = ZEXT1664(local_ad0);
        auVar160 = ZEXT1664(local_ac0);
        auVar184 = ZEXT1664(local_af0);
        auVar199 = ZEXT1664(local_b00);
        auVar210 = ZEXT1664(local_b10);
        auVar215 = ZEXT1664(local_b20);
        auVar233 = ZEXT1664(local_b30);
        auVar247 = ZEXT1664(local_b40);
        auVar138 = ZEXT1664(local_b50);
        auVar150 = ZEXT1664(local_b60);
        uVar58 = local_cc8;
      }
      else {
        local_cf0 = *(long *)(uVar66 & 0xfffffffffffffff0);
        fVar72 = (float)(*(int *)(local_cf0 + 8) - 1);
        fVar3 = fVar72 * (ray->dir).field_0.m128[3];
        auVar74 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
        auVar74 = vminss_avx(auVar74,ZEXT416((uint)(fVar72 + -1.0)));
        auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
        local_ab0 = ZEXT416((uint)(fVar3 - auVar74._0_4_));
        local_cd0 = (int)auVar74._0_4_;
        uVar66 = *(ulong *)(local_cf0 + 0x30 +
                           (ulong)*(uint *)(local_cf0 + 0x2c) + (long)local_cd0 * 8);
        if (uVar66 != 0) {
          *puVar65 = uVar66;
          puVar65 = puVar65 + 1;
        }
      }
LAB_002c997c:
    } while (puVar65 != &local_800);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }